

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequential_attribute_decoders_controller.cc
# Opt level: O0

bool __thiscall
draco::SequentialAttributeDecodersController::DecodeAttributes
          (SequentialAttributeDecodersController *this,DecoderBuffer *buffer)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  PointCloud *pPVar5;
  pointer pPVar6;
  PointCloud *in_RDI;
  PointAttribute *pa;
  int i;
  int32_t num_attributes;
  vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
  *in_stack_ffffffffffffffc8;
  PointAttribute *in_stack_ffffffffffffffd8;
  uint local_20;
  int32_t att_id;
  
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<draco::PointsSequencer,_std::default_delete<draco::PointsSequencer>_>
                      *)0x1ddfc1);
  if (bVar1) {
    std::unique_ptr<draco::PointsSequencer,_std::default_delete<draco::PointsSequencer>_>::
    operator->((unique_ptr<draco::PointsSequencer,_std::default_delete<draco::PointsSequencer>_> *)
               0x1ddfd5);
    bVar1 = PointsSequencer::GenerateSequence((PointsSequencer *)in_RDI,in_stack_ffffffffffffffc8);
    if (bVar1) {
      iVar2 = (*in_RDI->_vptr_PointCloud[6])();
      local_20 = 0;
      while( true ) {
        if (iVar2 <= (int)local_20) {
          bVar1 = AttributesDecoder::DecodeAttributes
                            ((AttributesDecoder *)in_stack_ffffffffffffffd8,(DecoderBuffer *)in_RDI)
          ;
          return bVar1;
        }
        iVar3 = (*in_RDI->_vptr_PointCloud[7])();
        pPVar5 = PointCloudDecoder::point_cloud((PointCloudDecoder *)CONCAT44(extraout_var,iVar3));
        att_id = (int32_t)((ulong)pPVar5 >> 0x20);
        (*in_RDI->_vptr_PointCloud[5])(in_RDI,(ulong)local_20);
        in_stack_ffffffffffffffd8 = PointCloud::attribute(in_RDI,att_id);
        pPVar6 = std::
                 unique_ptr<draco::PointsSequencer,_std::default_delete<draco::PointsSequencer>_>::
                 operator->((unique_ptr<draco::PointsSequencer,_std::default_delete<draco::PointsSequencer>_>
                             *)0x1de059);
        uVar4 = (*pPVar6->_vptr_PointsSequencer[2])(pPVar6,in_stack_ffffffffffffffd8);
        if ((uVar4 & 1) == 0) break;
        local_20 = local_20 + 1;
      }
      return false;
    }
  }
  return false;
}

Assistant:

bool SequentialAttributeDecodersController::DecodeAttributes(
    DecoderBuffer *buffer) {
  if (!sequencer_ || !sequencer_->GenerateSequence(&point_ids_)) {
    return false;
  }
  // Initialize point to attribute value mapping for all decoded attributes.
  const int32_t num_attributes = GetNumAttributes();
  for (int i = 0; i < num_attributes; ++i) {
    PointAttribute *const pa =
        GetDecoder()->point_cloud()->attribute(GetAttributeId(i));
    if (!sequencer_->UpdatePointToAttributeIndexMapping(pa)) {
      return false;
    }
  }
  return AttributesDecoder::DecodeAttributes(buffer);
}